

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberParser.h
# Opt level: O3

IntResult * __thiscall
slang::parsing::NumberParser::parseInteger<slang::parsing::Preprocessor,true>
          (IntResult *__return_storage_ptr__,NumberParser *this,Preprocessor *stream)

{
  IntResult *pIVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  SourceLocation SVar5;
  Info *pIVar6;
  int iVar8;
  Token TVar11;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar12;
  Token TVar13;
  Token sizeToken_00;
  Token baseToken;
  Token sizeToken;
  Token first;
  Token token;
  anon_class_16_2_049d3a7c createSimple;
  Token local_e8;
  Token local_d8;
  IntResult *local_c0;
  Token local_b8;
  Token local_a8;
  Token local_98;
  Token *local_88;
  NumberParser *pNStack_80;
  Token local_78;
  Token local_68;
  Token local_50;
  Token local_40;
  undefined8 uVar7;
  undefined8 uVar9;
  Info *pIVar10;
  
  Token::Token(&local_d8);
  Token::Token(&local_e8);
  TVar11 = Preprocessor::consume(stream);
  local_98 = TVar11;
  if (TVar11.kind == IntegerBase) {
    local_e8 = TVar11;
    Token::Token(&local_40);
  }
  else {
    local_88 = &local_98;
    pNStack_80 = this;
    bVar3 = Preprocessor::peekSameLine(stream);
    if ((!bVar3) ||
       (TVar13 = Preprocessor::peek(stream), TVar11 = local_98, TVar13.kind != IntegerBase)) {
      parseInteger<slang::parsing::Preprocessor,_true>::anon_class_16_2_049d3a7c::operator()
                (__return_storage_ptr__,(anon_class_16_2_049d3a7c *)&local_88);
      return __return_storage_ptr__;
    }
    local_d8.kind = local_98.kind;
    local_d8._2_1_ = local_98._2_1_;
    local_d8.numFlags.raw = local_98.numFlags.raw;
    local_d8.rawLen = local_98.rawLen;
    local_d8.info = local_98.info;
    local_98 = TVar11;
    TVar11 = Preprocessor::consume(stream);
    local_40._0_8_ = local_d8._0_8_;
    local_40.info = local_d8.info;
    local_e8 = TVar11;
  }
  TVar13.info = local_40.info;
  TVar13.kind = local_40.kind;
  TVar13._2_1_ = local_40._2_1_;
  TVar13.numFlags.raw = local_40.numFlags.raw;
  TVar13.rawLen = local_40.rawLen;
  startVector(this,TVar11,TVar13);
  local_c0 = __return_storage_ptr__;
  bVar3 = Preprocessor::peekSameLine(stream);
  pIVar6 = local_d8.info;
  uVar7 = local_d8._0_8_;
  if (bVar3) {
    local_a8 = Preprocessor::peek(stream);
    bVar3 = slang::syntax::SyntaxFacts::isPossibleVectorDigit(local_a8.kind);
    if (bVar3) {
      local_b8 = local_a8;
      SVar5 = Token::location(&local_a8);
      this->firstLocation = SVar5;
      iVar2 = 0;
      while( true ) {
        iVar8 = iVar2;
        uVar4 = append(this,local_b8,iVar8 == 0);
        Preprocessor::consume(stream);
        if (-1 < (int)uVar4) {
          local_88 = (Token *)local_b8._0_8_;
          pNStack_80 = (NumberParser *)local_b8.info;
          SVar5 = Token::location((Token *)&local_88);
          Preprocessor::addDiag
                    (stream,(DiagCode)0x80004,
                     (SourceLocation)((ulong)uVar4 * 0x10000000 + (long)SVar5));
          bVar3 = false;
          goto LAB_001a24fa;
        }
        bVar3 = Preprocessor::peekSameLine(stream);
        if (!bVar3) break;
        local_b8 = Preprocessor::peek(stream);
        bVar3 = slang::syntax::SyntaxFacts::isPossibleVectorDigit(local_b8.kind);
        if ((!bVar3) || (sVar12 = Token::trivia(&local_b8), iVar2 = iVar8 + -1, sVar12.size_ != 0))
        break;
      }
      bVar3 = iVar8 == 0;
LAB_001a24fa:
      TVar11 = local_e8;
      local_68.kind = local_d8.kind;
      local_68._2_1_ = local_d8._2_1_;
      local_68.numFlags.raw = local_d8.numFlags.raw;
      local_68.rawLen = local_d8.rawLen;
      local_68.info = local_d8.info;
      local_78.kind = local_e8.kind;
      local_78._2_1_ = local_e8._2_1_;
      local_78.numFlags.raw = local_e8.numFlags.raw;
      local_78.rawLen = local_e8.rawLen;
      local_78.info = local_e8.info;
      local_e8 = TVar11;
      TVar11 = finishValue(this,local_a8,bVar3);
      (local_c0->size).kind = local_68.kind;
      (local_c0->size).field_0x2 = local_68._2_1_;
      (local_c0->size).numFlags = (NumericTokenFlags)local_68.numFlags.raw;
      (local_c0->size).rawLen = local_68.rawLen;
      (local_c0->size).info = local_68.info;
      (local_c0->base).kind = local_78.kind;
      (local_c0->base).field_0x2 = local_78._2_1_;
      (local_c0->base).numFlags = (NumericTokenFlags)local_78.numFlags.raw;
      (local_c0->base).rawLen = local_78.rawLen;
      (local_c0->base).info = local_78.info;
      local_c0->value = TVar11;
      local_c0->isSimple = false;
      return local_c0;
    }
    pIVar6 = local_d8.info;
    uVar7 = local_d8._0_8_;
    uVar9 = local_e8._0_8_;
    pIVar10 = local_e8.info;
    local_50._0_8_ = local_a8._0_8_;
    local_50.info = local_a8.info;
  }
  else {
    uVar9 = local_e8._0_8_;
    pIVar10 = local_e8.info;
    Token::Token(&local_50);
  }
  pIVar1 = local_c0;
  TVar11.info = local_50.info;
  TVar11.kind = local_50.kind;
  TVar11._2_1_ = local_50._2_1_;
  TVar11.numFlags.raw = local_50.numFlags.raw;
  TVar11.rawLen = local_50.rawLen;
  sizeToken_00.info = pIVar6;
  sizeToken_00.kind = (TokenKind)uVar7;
  sizeToken_00._2_1_ = SUB81(uVar7,2);
  sizeToken_00.numFlags.raw = SUB81(uVar7,3);
  sizeToken_00.rawLen = SUB84(uVar7,4);
  baseToken.info = pIVar10;
  baseToken.kind = (TokenKind)uVar9;
  baseToken._2_1_ = SUB81(uVar9,2);
  baseToken.numFlags.raw = SUB81(uVar9,3);
  baseToken.rawLen = SUB84(uVar9,4);
  reportMissingDigits(local_c0,this,sizeToken_00,baseToken,TVar11);
  return pIVar1;
}

Assistant:

IntResult parseInteger(TStream& stream) {
        Token sizeToken;
        Token baseToken;

        auto token = stream.consume();
        if (token.kind == TokenKind::IntegerBase) {
            baseToken = token;
            startVector(baseToken, Token());
        }
        else {
            auto createSimple = [&] {
                if (token.intValue() > INT32_MAX)
                    reportIntOverflow(token);
                return IntResult::simple(token);
            };

            if constexpr (RequireSameLine) {
                if (!stream.peekSameLine())
                    return createSimple();
            }

            if (!stream.peek(TokenKind::IntegerBase))
                return createSimple();

            sizeToken = token;
            baseToken = stream.consume();
            startVector(baseToken, sizeToken);
        }

        if constexpr (RequireSameLine) {
            if (!stream.peekSameLine())
                return reportMissingDigits(sizeToken, baseToken, Token());
        }

        // At this point we expect to see vector digits, but they could be split out into other
        // token types because of hex literals.
        auto first = stream.peek();
        if (!syntax::SyntaxFacts::isPossibleVectorDigit(first.kind))
            return reportMissingDigits(sizeToken, baseToken, first);

        int count = 0;
        Token next = first;
        firstLocation = first.location();

        do {
            count++;
            int index = append(next, count == 1);
            stream.consume();

            if (index >= 0) {
                // This handles a really obnoxious case: 'h 3e+2
                // The second token is initially lexed as a real literal, but we need to split
                // it apart here now that we know it's a hex literal and put the remaining (new)
                // tokens back on the parser's stack.
                stream.handleExponentSplit(next, (size_t)index);

                // Bump the count so that we definitely take the modified raw text
                // instead of trying to use the initial token's raw directly.
                count++;
                break;
            }

            if constexpr (RequireSameLine) {
                if (!stream.peekSameLine())
                    break;
            }

            next = stream.peek();
        } while (syntax::SyntaxFacts::isPossibleVectorDigit(next.kind) && next.trivia().empty());

        return IntResult::vector(sizeToken, baseToken, finishValue(first, count == 1));
    }